

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_calc_subpel_params
               (MV *src_mv,InterPredParams *inter_pred_params,MACROBLOCKD *xd,int mi_x,int mi_y,
               uint8_t **pre,SubpelParams *subpel_params,int *src_stride,PadBlock *block,
               MV32 *scaled_mv,int *subpel_x_mv,int *subpel_y_mv)

{
  int iVar1;
  int iVar2;
  scale_factors *sf_00;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int high;
  int high_00;
  uint uVar8;
  uint uVar9;
  MV MVar10;
  MV32 MVar11;
  long in_RSI;
  short *in_RDI;
  long *in_R9;
  int *in_stack_00000008;
  MV mv_q4;
  int pos_y_1;
  int pos_x_1;
  MV32 *in_stack_00000020;
  MV temp_mv;
  int right;
  int bottom;
  int left;
  int top;
  int pos_x;
  int pos_y;
  int orig_pos_x;
  int orig_pos_y;
  int ssy;
  int ssx;
  int is_scaled;
  int bh;
  int bw;
  buf_2d *pre_buf;
  scale_factors *sf;
  scale_factors *in_stack_ffffffffffffff68;
  scale_factors *in_stack_ffffffffffffff70;
  MV32 *pMVar12;
  undefined2 in_stack_ffffffffffffff78;
  short sVar13;
  undefined2 in_stack_ffffffffffffff7a;
  short sVar14;
  undefined4 in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  sf_00 = *(scale_factors **)(in_RSI + 0xa8);
  iVar1 = *(int *)(in_RSI + 0x70);
  iVar2 = *(int *)(in_RSI + 0x74);
  iVar5 = av1_is_scaled(in_stack_ffffffffffffff70);
  if (iVar5 == 0) {
    iVar5 = *(int *)(in_RSI + 0x7c) << 4;
    iVar6 = *(int *)(in_RSI + 0x78) << 4;
    MVar10 = clamp_mv_to_umv_border_sb
                       ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                        ,(MV *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c,(int)((ulong)in_stack_ffffffffffffff84 >> 0x20),
                        (int)in_stack_ffffffffffffff84,iVar5);
    sVar13 = MVar10.row;
    sVar14 = MVar10.col;
    in_stack_00000008[1] = 0x400;
    *in_stack_00000008 = 0x400;
    in_stack_00000008[2] = ((int)sVar14 & 0xfU) << 6;
    in_stack_00000008[3] = ((int)sVar13 & 0xfU) << 6;
    iVar5 = sVar14 + iVar5 >> 4;
    *_pos_x_1 = iVar5;
    iVar6 = sVar13 + iVar6 >> 4;
    _pos_x_1[2] = iVar6;
    _pos_x_1[1] = iVar5 + iVar1;
    _pos_x_1[3] = iVar6 + iVar2;
    in_stack_00000020->row = (int)sVar13;
    in_stack_00000020->col = (int)sVar14;
    *_temp_mv = in_stack_00000020->col & 0xf;
    *_bottom = in_stack_00000020->row & 0xf;
  }
  else {
    bVar3 = (byte)*(undefined4 *)(in_RSI + 0xa4);
    iVar5 = *(int *)(in_RSI + 0x7c);
    sVar13 = in_RDI[1];
    bVar4 = (byte)*(undefined4 *)(in_RSI + 0xa0);
    iVar6 = av1_scaled_y((int)*in_RDI * (1 << (1 - bVar3 & 0x1f)) + *(int *)(in_RSI + 0x78) * 0x10,
                         sf_00);
    iVar7 = av1_scaled_x((int)sVar13 * (1 << (1 - bVar4 & 0x1f)) + iVar5 * 0x10,sf_00);
    iVar5 = ((0x120 >> (bVar4 & 0x1f)) + -4) * -0x400;
    high = (*(int *)(in_RSI + 0x94) + 4) * 0x400;
    high_00 = (*(int *)(in_RSI + 0x90) + 4) * 0x400;
    uVar8 = clamp(iVar6 + 0x20,((0x120 >> (bVar3 & 0x1f)) + -4) * -0x400,high);
    uVar9 = clamp(iVar7 + 0x20,iVar5,high_00);
    in_stack_00000008[2] = uVar9 & 0x3ff;
    in_stack_00000008[3] = uVar8 & 0x3ff;
    *in_stack_00000008 = sf_00->x_step_q4;
    in_stack_00000008[1] = sf_00->y_step_q4;
    *_pos_x_1 = (int)uVar9 >> 10;
    _pos_x_1[2] = (int)uVar8 >> 10;
    _pos_x_1[1] = ((int)(uVar9 + (iVar1 + -1) * *in_stack_00000008) >> 10) + 1;
    _pos_x_1[3] = ((int)(uVar8 + (iVar2 + -1) * in_stack_00000008[1]) >> 10) + 1;
    clamp_mv_to_umv_border_sb
              ((MACROBLOCKD *)CONCAT44(iVar5,high),(MV *)CONCAT44(high_00,in_stack_ffffffffffffff90)
               ,in_stack_ffffffffffffff8c,(int)((ulong)in_stack_ffffffffffffff84 >> 0x20),
               (int)in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    pMVar12 = in_stack_00000020;
    MVar11 = av1_scale_mv((MV *)CONCAT44(in_stack_ffffffffffffff7c,
                                         CONCAT22(in_stack_ffffffffffffff7a,
                                                  in_stack_ffffffffffffff78)),
                          (int)((ulong)in_stack_00000020 >> 0x20),(int)in_stack_00000020,
                          in_stack_ffffffffffffff68);
    *pMVar12 = MVar11;
    in_stack_00000020->row = in_stack_00000020->row + 0x20;
    in_stack_00000020->col = in_stack_00000020->col + 0x20;
    *_temp_mv = in_stack_00000020->col & 0x3ff;
    *_bottom = in_stack_00000020->row & 0x3ff;
  }
  *in_R9 = *(long *)(in_RSI + 0x88) + (long)(_pos_x_1[2] * *(int *)(in_RSI + 0x98)) +
           (long)*_pos_x_1;
  *_mv_q4 = *(undefined4 *)(in_RSI + 0x98);
  return;
}

Assistant:

static inline void dec_calc_subpel_params(
    const MV *const src_mv, InterPredParams *const inter_pred_params,
    const MACROBLOCKD *const xd, int mi_x, int mi_y, uint8_t **pre,
    SubpelParams *subpel_params, int *src_stride, PadBlock *block,
    MV32 *scaled_mv, int *subpel_x_mv, int *subpel_y_mv) {
  const struct scale_factors *sf = inter_pred_params->scale_factors;
  struct buf_2d *pre_buf = &inter_pred_params->ref_frame_buf;
  const int bw = inter_pred_params->block_width;
  const int bh = inter_pred_params->block_height;
  const int is_scaled = av1_is_scaled(sf);
  if (is_scaled) {
    int ssx = inter_pred_params->subsampling_x;
    int ssy = inter_pred_params->subsampling_y;
    int orig_pos_y = inter_pred_params->pix_row << SUBPEL_BITS;
    orig_pos_y += src_mv->row * (1 << (1 - ssy));
    int orig_pos_x = inter_pred_params->pix_col << SUBPEL_BITS;
    orig_pos_x += src_mv->col * (1 << (1 - ssx));
    int pos_y = av1_scaled_y(orig_pos_y, sf);
    int pos_x = av1_scaled_x(orig_pos_x, sf);
    pos_x += SCALE_EXTRA_OFF;
    pos_y += SCALE_EXTRA_OFF;

    const int top = -AOM_LEFT_TOP_MARGIN_SCALED(ssy);
    const int left = -AOM_LEFT_TOP_MARGIN_SCALED(ssx);
    const int bottom = (pre_buf->height + AOM_INTERP_EXTEND)
                       << SCALE_SUBPEL_BITS;
    const int right = (pre_buf->width + AOM_INTERP_EXTEND) << SCALE_SUBPEL_BITS;
    pos_y = clamp(pos_y, top, bottom);
    pos_x = clamp(pos_x, left, right);

    subpel_params->subpel_x = pos_x & SCALE_SUBPEL_MASK;
    subpel_params->subpel_y = pos_y & SCALE_SUBPEL_MASK;
    subpel_params->xs = sf->x_step_q4;
    subpel_params->ys = sf->y_step_q4;

    // Get reference block top left coordinate.
    block->x0 = pos_x >> SCALE_SUBPEL_BITS;
    block->y0 = pos_y >> SCALE_SUBPEL_BITS;

    // Get reference block bottom right coordinate.
    block->x1 =
        ((pos_x + (bw - 1) * subpel_params->xs) >> SCALE_SUBPEL_BITS) + 1;
    block->y1 =
        ((pos_y + (bh - 1) * subpel_params->ys) >> SCALE_SUBPEL_BITS) + 1;

    MV temp_mv;
    temp_mv = clamp_mv_to_umv_border_sb(xd, src_mv, bw, bh,
                                        inter_pred_params->subsampling_x,
                                        inter_pred_params->subsampling_y);
    *scaled_mv = av1_scale_mv(&temp_mv, mi_x, mi_y, sf);
    scaled_mv->row += SCALE_EXTRA_OFF;
    scaled_mv->col += SCALE_EXTRA_OFF;

    *subpel_x_mv = scaled_mv->col & SCALE_SUBPEL_MASK;
    *subpel_y_mv = scaled_mv->row & SCALE_SUBPEL_MASK;
  } else {
    // Get block position in current frame.
    int pos_x = inter_pred_params->pix_col << SUBPEL_BITS;
    int pos_y = inter_pred_params->pix_row << SUBPEL_BITS;

    const MV mv_q4 = clamp_mv_to_umv_border_sb(
        xd, src_mv, bw, bh, inter_pred_params->subsampling_x,
        inter_pred_params->subsampling_y);
    subpel_params->xs = subpel_params->ys = SCALE_SUBPEL_SHIFTS;
    subpel_params->subpel_x = (mv_q4.col & SUBPEL_MASK) << SCALE_EXTRA_BITS;
    subpel_params->subpel_y = (mv_q4.row & SUBPEL_MASK) << SCALE_EXTRA_BITS;

    // Get reference block top left coordinate.
    pos_x += mv_q4.col;
    pos_y += mv_q4.row;
    block->x0 = pos_x >> SUBPEL_BITS;
    block->y0 = pos_y >> SUBPEL_BITS;

    // Get reference block bottom right coordinate.
    block->x1 = (pos_x >> SUBPEL_BITS) + (bw - 1) + 1;
    block->y1 = (pos_y >> SUBPEL_BITS) + (bh - 1) + 1;

    scaled_mv->row = mv_q4.row;
    scaled_mv->col = mv_q4.col;
    *subpel_x_mv = scaled_mv->col & SUBPEL_MASK;
    *subpel_y_mv = scaled_mv->row & SUBPEL_MASK;
  }
  *pre = pre_buf->buf0 + block->y0 * pre_buf->stride + block->x0;
  *src_stride = pre_buf->stride;
}